

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clone.cpp
# Opt level: O0

void __thiscall helics::apps::Clone::runTo(Clone *this,Time runToTime)

{
  bool bVar1;
  ostream *poVar2;
  baseType in_RSI;
  long *in_RDI;
  double dVar3;
  iteration_time iVar4;
  iteration_time ItRes;
  Time grantedTime;
  int iteration;
  Time nextPrintTime;
  int in_stack_0000013c;
  Clone *in_stack_00000140;
  Time in_stack_00000148;
  IterationRequest in_stack_ffffffffffffffb7;
  Federate *in_stack_ffffffffffffffb8;
  IterationResult in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd1;
  Time in_stack_ffffffffffffffd8;
  TimeRepresentation<count_time<9,_long>_> local_18 [2];
  TimeRepresentation<count_time<9,_long>_> local_8;
  
  local_8.internalTimeCode = in_RSI;
  (**(code **)(*in_RDI + 0x10))();
  bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>
                    ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x15),
                     (TimeRepresentation<count_time<9,_long>_> *)&helics::timeZero);
  if (bVar1) {
    local_18[0].internalTimeCode = in_RDI[0x15];
  }
  else {
    local_18[0] = TimeRepresentation<count_time<9,_long>_>::maxVal();
  }
  while( true ) {
    if ((*(byte *)(in_RDI + 0x14) & 1) == 0) {
      CLI::std::
      __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x25b5fd);
      in_stack_ffffffffffffffd8 =
           Federate::requestTime
                     ((Federate *)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffd8);
      captureForCurrentTime(in_stack_00000140,in_stack_00000148,in_stack_0000013c);
    }
    else {
      CLI::std::
      __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x25b4f8);
      iVar4 = Federate::requestTimeIterative
                        (in_stack_ffffffffffffffb8,(Time)local_8.internalTimeCode,
                         in_stack_ffffffffffffffb7);
      in_stack_ffffffffffffffd8 = iVar4.grantedTime.internalTimeCode;
      in_stack_ffffffffffffffd0 = iVar4.state;
      captureForCurrentTime(in_stack_00000140,in_stack_00000148,in_stack_0000013c);
    }
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>=
                      ((TimeRepresentation<count_time<9,_long>_> *)&stack0xffffffffffffffd8,&local_8
                      );
    if (bVar1) break;
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>=
                      ((TimeRepresentation<count_time<9,_long>_> *)&stack0xffffffffffffffd8,local_18
                      );
    if ((bVar1) &&
       (bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>
                          ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x15),
                           (TimeRepresentation<count_time<9,_long>_> *)&helics::timeZero), bVar1)) {
      poVar2 = std::operator<<((ostream *)&std::cout,"processed for time ");
      dVar3 = TimeRepresentation::operator_cast_to_double
                        ((TimeRepresentation<count_time<9,_long>_> *)0x25b6e4);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar3);
      std::operator<<(poVar2,"\n");
      TimeRepresentation<count_time<9,_long>_>::operator+=
                (local_18,(TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x15));
    }
  }
  return;
}

Assistant:

void Clone::runTo(Time runToTime)
{
    initialize();

    Time nextPrintTime = (nextPrintTimeStep > timeZero) ? nextPrintTimeStep : Time::maxVal();
    try {
        int iteration = 0;
        while (true) {
            helics::Time grantedTime;
            if (allow_iteration) {
                auto ItRes =
                    fed->requestTimeIterative(runToTime, IterationRequest::ITERATE_IF_NEEDED);
                if (ItRes.state == IterationResult::NEXT_STEP) {
                    iteration = 0;
                }
                grantedTime = ItRes.grantedTime;
                captureForCurrentTime(grantedTime, iteration);
                ++iteration;
            } else {
                grantedTime = fed->requestTime(runToTime);
                captureForCurrentTime(grantedTime);
            }

            if (grantedTime >= runToTime) {
                break;
            }
            if ((grantedTime >= nextPrintTime) && (nextPrintTimeStep > timeZero)) {
                std::cout << "processed for time " << static_cast<double>(grantedTime) << "\n";
                nextPrintTime += nextPrintTimeStep;
            }
        }
    }
    catch (...) {
        std::cerr << "error generate on run\n";
    }
}